

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoveCardsOperationSnapshotCreator.cpp
# Opt level: O2

void __thiscall
solitaire::archivers::MoveCardsOperationSnapshotCreator::saveSourcePileSnapshot
          (MoveCardsOperationSnapshotCreator *this,
          unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
          *snapshot)

{
  MoveCardsOperationSnapshotCreator *this_00;
  
  this_00 = this;
  throwIfSourcePileSnapshotIsNotNullptr(this);
  throwIfSnapshotIsNullptr(this_00,snapshot);
  std::
  __uniq_ptr_impl<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
  ::operator=((__uniq_ptr_impl<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
               *)&this->sourcePileSnapshot,
              (__uniq_ptr_impl<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
               *)snapshot);
  return;
}

Assistant:

void MoveCardsOperationSnapshotCreator::saveSourcePileSnapshot(
    std::unique_ptr<interfaces::Snapshot> snapshot)
{
    throwIfSourcePileSnapshotIsNotNullptr();
    throwIfSnapshotIsNullptr(snapshot);
    sourcePileSnapshot = std::move(snapshot);
}